

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

void dropt_free_context(dropt_context *context)

{
  dropt_clear_error(context);
  free_lookup_tables(context);
  free(context);
  return;
}

Assistant:

void
dropt_free_context(dropt_context* context)
{
    dropt_clear_error(context);
    free_lookup_tables(context);
    free(context);
}